

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O2

void __thiscall MingwMakefileGenerator::writeIncPart(MingwMakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  int iVar2;
  ProStringList *objList;
  ProString *pPVar3;
  QTextStream *pQVar4;
  long lVar5;
  int iVar6;
  ProString *incit;
  long in_FS_OFFSET;
  QRegularExpression local_c0 [8];
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  QArrayDataPointer<char16_t> local_68 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(t,"INCPATH       = ");
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_68,"INCLUDEPATH");
  objList = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
  local_78 = 0xaaaaaaaaaaaaaaaa;
  uStack_70 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_78);
  local_88 = 0xaaaaaaaaaaaaaaaa;
  uStack_80 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_88);
  pPVar3 = (objList->super_QList<ProString>).d.ptr;
  iVar6 = 0;
  for (lVar5 = (objList->super_QList<ProString>).d.size * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
    iVar6 = iVar6 + pPVar3->m_length + 2;
    pPVar3 = pPVar3 + 1;
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_68,"QMAKE_RESPONSEFILE_THRESHOLD");
  iVar2 = QMakeProject::intValue(pQVar1,(ProKey *)local_68,8000);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
  if (iVar2 < iVar6) {
    local_68[0].size = -0x5555555555555556;
    local_68[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68[0].ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_a0,"incpath");
    QString::QString((QString *)&local_b8,"-I");
    MakefileGenerator::createResponseFile
              ((QString *)local_68,(MakefileGenerator *)this,(QString *)&local_a0,objList,
               (QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    if (local_68[0].size != 0) {
      local_a0.d._0_1_ = 0x40;
      local_a0.ptr = (char16_t *)local_68;
      operator<<(t,(QStringBuilder<char,_const_QString_&> *)&local_a0);
      Qt::endl(t);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
      goto LAB_0019cb13;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
  }
  pPVar3 = (objList->super_QList<ProString>).d.ptr;
  for (lVar5 = (objList->super_QList<ProString>).d.size * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
    local_68[0].size = -0x5555555555555556;
    local_68[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68[0].ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::toQString((QString *)local_68,pPVar3);
    QString::QString((QString *)&local_a0,"\\\\$");
    QRegularExpression::QRegularExpression(local_c0,&local_a0,0);
    QString::QString((QString *)&local_b8,"");
    QString::replace((QRegularExpression *)local_68,(QString *)local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QRegularExpression::~QRegularExpression(local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QString::replace((QChar)(char16_t)local_68,(QChar)0x5c,0x2f);
    pQVar4 = (QTextStream *)QTextStream::operator<<(t,"-I");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_a0,this,local_68);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&local_a0);
    QTextStream::operator<<(pQVar4,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_68);
    pPVar3 = pPVar3 + 1;
  }
  Qt::endl(t);
LAB_0019cb13:
  QTextStream::~QTextStream((QTextStream *)&local_88);
  QFile::~QFile((QFile *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MingwMakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    QFile responseFile;
    QTextStream responseStream;
    QChar sep(' ');
    int totalLength = std::accumulate(incs.constBegin(), incs.constEnd(), 0,
                                      [](int total, const ProString &inc) {
        return total + inc.size() + 2;
    });
    if (totalLength > project->intValue("QMAKE_RESPONSEFILE_THRESHOLD", 8000)) {
        const QString fileName = createResponseFile("incpath", incs, "-I");
        if (!fileName.isEmpty()) {
            t << '@' + fileName;
            t << Qt::endl;
            return;
        }
    }
    for (const ProString &incit: std::as_const(incs)) {
        QString inc = incit.toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        inc.replace('\\', '/');
        t << "-I" << escapeFilePath(inc) << sep;
    }
    t << Qt::endl;
}